

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssutil.cpp
# Opt level: O0

bool paintsOver(BorderStyle *styles,QBrush *colors,Edge e1,Edge e2)

{
  int iVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  uint in_ECX;
  uint in_EDX;
  QBrush *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  BorderStyle s2;
  BorderStyle s1;
  QBrush *in_stack_00000028;
  bool local_31;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *(int *)(in_RDI + (ulong)in_EDX * 4);
  iVar2 = *(int *)(in_RDI + (ulong)in_ECX * 4);
  local_31 = true;
  if (iVar2 != 1) {
    in_stack_fffffffffffffff4 = 0x13;
    local_31 = operator==(in_RSI,(GlobalColor *)CONCAT44(in_EDX,in_ECX));
  }
  if (local_31 == false) {
    if ((((iVar1 == 4) && (iVar2 == 4)) &&
        (bVar4 = QBrush::operator==(in_stack_00000028,(QBrush *)styles), bVar4)) &&
       (bVar4 = QBrush::isOpaque((QBrush *)
                                 CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0)),
       bVar4)) {
      bVar4 = true;
    }
    else {
      bVar4 = false;
    }
  }
  else {
    bVar4 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

static bool paintsOver(const QCss::BorderStyle *styles, const QBrush *colors, QCss::Edge e1, QCss::Edge e2)
{
    QCss::BorderStyle s1 = styles[e1];
    QCss::BorderStyle s2 = styles[e2];

    if (s2 == BorderStyle_None || colors[e2] == Qt::transparent)
        return true;

    if ((s1 == BorderStyle_Solid && s2 == BorderStyle_Solid) && (colors[e1] == colors[e2])
            && colors[e1].isOpaque()) {
        return true;
    }

    return false;
}